

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O2

void __thiscall
QGraphicsSceneLinearIndex::removeItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  QGraphicsSceneLinearIndex *this_00;
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x10;
  local_30 = item;
  if ((long)*(int *)(this + 0x28) < *(long *)(this + 0x20)) {
    iVar2 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    iVar1 = *(int *)(this + 0x28);
    iVar3 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
    std::__sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i + iVar1,iVar3.i);
    iVar2 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    iVar3 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
    iVar1 = *(int *)(this + 0x28);
    iVar4 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
    std::__inplace_merge<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i + iVar1,iVar4.i);
    *(undefined4 *)(this + 0x28) = *(undefined4 *)(this + 0x20);
  }
  iVar2 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)this_00);
  iVar3 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
  iVar2 = std::
          __lower_bound<QList<QGraphicsItem*>::iterator,QGraphicsItem*,__gnu_cxx::__ops::_Iter_less_val>
                    (iVar2.i,iVar3.i,&local_30);
  iVar3 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)this_00);
  if ((iVar2.i != iVar3.i) && (*iVar2.i == local_30)) {
    QList<QGraphicsItem_*>::erase((QList<QGraphicsItem_*> *)this_00,(const_iterator)iVar2.i);
    *(int *)(this + 0x28) = *(int *)(this + 0x28) + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual void removeItem(QGraphicsItem *item) override
    {
        // Sort m_items if needed
        if (m_numSortedElements < m_items.size())
        {
            std::sort(m_items.begin() + m_numSortedElements, m_items.end() );
            std::inplace_merge(m_items.begin(), m_items.begin() + m_numSortedElements, m_items.end());
            m_numSortedElements = m_items.size();
        }

        QList<QGraphicsItem*>::iterator element = std::lower_bound(m_items.begin(), m_items.end(), item);
        if (element != m_items.end() && *element == item)
        {
            m_items.erase(element);
            --m_numSortedElements;
        }
    }